

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double * r8mat_mtv_new(int m,int n,double *a,double *x)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *y;
  int j;
  int i;
  double *x_local;
  double *a_local;
  int n_local;
  int m_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (y._0_4_ = 0; (int)y < n; y._0_4_ = (int)y + 1) {
    pdVar3[(int)y] = 0.0;
    for (y._4_4_ = 0; y._4_4_ < m; y._4_4_ = y._4_4_ + 1) {
      pdVar3[(int)y] = a[y._4_4_ + (int)y * m] * x[y._4_4_] + pdVar3[(int)y];
    }
  }
  return pdVar3;
}

Assistant:

double *r8mat_mtv_new ( int m, int n, double a[], double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_MTV_NEW multiplies a transposed matrix times a vector.
//
//  Discussion:
//
//    An R8MAT is a doubly dimensioned array of R8 values, stored as a vector
//    in column-major order.
//
//    For this routine, the result is returned as the function value.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns of the matrix.
//
//    Input, double A[M,N], the M by N matrix.
//
//    Input, double X[M], the vector to be multiplied by A.
//
//    Output, double R8MAT_MTV_NEW[N], the product A'*X.
//
{
  int i;
  int j;
  double *y;

  y = new double[n];

  for ( j = 0; j < n; j++ )
  {
    y[j] = 0.0;
    for ( i = 0; i < m; i++ )
    {
      y[j] = y[j] + a[i+j*m] * x[i];
    }
  }

  return y;
}